

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl.cxx
# Opt level: O0

void Fl::release_widget_pointer(Fl_Widget **w)

{
  int local_20;
  int local_1c;
  int j;
  int i;
  Fl_Widget **wp;
  Fl_Widget **w_local;
  
  local_20 = 0;
  for (local_1c = 0; local_1c < num_widget_watch; local_1c = local_1c + 1) {
    if (widget_watch[local_1c] != w) {
      if (local_20 < local_1c) {
        widget_watch[local_20] = widget_watch[local_1c];
      }
      local_20 = local_20 + 1;
    }
  }
  num_widget_watch = local_20;
  return;
}

Assistant:

void Fl::release_widget_pointer(Fl_Widget *&w)
{
  Fl_Widget **wp = &w;
  int i,j=0;
  for (i=0; i<num_widget_watch; ++i) {
    if (widget_watch[i]!=wp) {
      if (j<i) widget_watch[j] = widget_watch[i]; // fill gap
      j++;
    }
#ifdef DEBUG_WATCH
    else { // found widget pointer
      printf ("release_widget_pointer: (%d/%d) %8p => %8p\n",
	i+1,num_widget_watch,wp,*wp);
    }
#endif //DEBUG_WATCH
  }
  num_widget_watch = j;
#ifdef DEBUG_WATCH
  printf ("                        num_widget_watch = %d\n\n",num_widget_watch);
  fflush(stdout);
#endif // DEBUG_WATCH
  return;
}